

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QPoint QMdi::MinOverlapPlacer::findBestPlacement
                 (QRect *domain,QList<QRect> *rects,QList<QRect> *source)

{
  undefined8 uVar1;
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  QRect QVar2;
  QList<QRect> local_68;
  QList<QRect> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  findNonInsiders(&local_48,domain,source);
  if ((source->d).size == 0) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
    findMaxOverlappers(&local_68,domain,&local_48);
    QVar2 = findMinOverlapRect(&local_68,rects);
    uVar1 = QVar2._0_8_;
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,0x10,0x10);
        QVar2.x2.m_i = (int)extraout_RDX;
        QVar2.y2.m_i = (int)((ulong)extraout_RDX >> 0x20);
        QVar2.x1.m_i = (int)uVar1;
        QVar2.y1.m_i = (int)((ulong)uVar1 >> 0x20);
      }
    }
  }
  else {
    QVar2 = findMinOverlapRect(source,rects);
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar2._0_8_;
  }
  __stack_chk_fail();
}

Assistant:

QPoint MinOverlapPlacer::findBestPlacement(const QRect &domain, const QList<QRect> &rects,
                                           QList<QRect> &source)
{
    const QList<QRect> nonInsiders = findNonInsiders(domain, source);

    if (!source.empty())
        return findMinOverlapRect(source, rects).topLeft();

    QList<QRect> maxOverlappers = findMaxOverlappers(domain, nonInsiders);
    return findMinOverlapRect(maxOverlappers, rects).topLeft();
}